

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O3

int __thiscall Typelib::Registry::remove(Registry *this,char *__filename)

{
  const_iterator __position;
  size_type sVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  Type *in_RDX;
  const_iterator __position_00;
  
  reverseDepends((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                  *)this,(Registry *)__filename,in_RDX);
  cVar2._M_node = *(_Base_ptr *)(__filename + 0x18);
  while (__position._M_node = cVar2._M_node, __position._M_node != (_Base_ptr)(__filename + 8)) {
    sVar1 = std::set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
            ::count((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                     *)this,(key_type *)(__position._M_node + 2));
    cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if (sVar1 != 0) {
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>,_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
      ::_M_erase_aux((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>,_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
                      *)__filename,__position);
    }
  }
  if (*(_Base_ptr *)(__filename + 0x48) != (_Base_ptr)(__filename + 0x38)) {
    __position_00._M_node = *(_Base_ptr *)(__filename + 0x48);
    do {
      sVar1 = std::
              set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>::
              count((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                     *)this,(key_type *)(__position_00._M_node + 2));
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
      if (sVar1 != 0) {
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
        ::_M_erase_aux((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
                        *)(__filename + 0x30),__position_00);
      }
      __position_00._M_node = p_Var3;
    } while (p_Var3 != (_Base_ptr)(__filename + 0x38));
  }
  return (int)this;
}

Assistant:

std::set<Type *> Registry::remove(Type const& type)
    {
        std::set<Type*> types = reverseDepends(type);

        TypeMap::iterator global_it = m_global.begin(), global_end = m_global.end();
        while (global_it != global_end)
        {
            if (types.count(global_it->second.type))
                m_global.erase(global_it++);
            else ++global_it;
        }

        NameMap::iterator current_it = m_current.begin(), current_end = m_current.end();
        while (current_it != current_end)
        {
            if (types.count(current_it->second.type))
                m_current.erase(current_it++);
            else ++current_it;
        }

        return types;
    }